

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O1

void __thiscall
MultiANN::NearestNeighbor
          (MultiANN *this,ANNpoint *x,ANNpoint *best_dist,int **best_idx,void ***best_ptr)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ANNpoint pAVar7;
  int *piVar8;
  int iVar9;
  long lVar10;
  int *piVar11;
  void *pvVar12;
  ANNpoint pAVar13;
  void *pvVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double *d1;
  int *node_list;
  long local_90;
  ANNpoint local_80;
  int *local_78;
  void ***local_70;
  double local_68;
  double local_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  ulong uStack_40;
  
  lVar10 = (long)this->NumNeighbors;
  uVar19 = lVar10 * 4;
  if (lVar10 < 0) {
    uVar19 = 0xffffffffffffffff;
  }
  uVar18 = lVar10 * 8;
  if (lVar10 < 0) {
    uVar18 = 0xffffffffffffffff;
  }
  local_70 = best_ptr;
  piVar11 = (int *)operator_new__(uVar19);
  local_78 = piVar11;
  pvVar12 = operator_new__(uVar19);
  pAVar13 = (ANNpoint)operator_new__(uVar18);
  local_80 = pAVar13;
  pvVar14 = operator_new__(uVar18);
  if (0 < this->NumNeighbors) {
    pAVar7 = *best_dist;
    piVar8 = *best_idx;
    lVar10 = 0;
    do {
      pAVar7[lVar10] = INFINITY;
      pAVar13[lVar10] = 0.0;
      *(undefined8 *)((long)pvVar14 + lVar10 * 8) = 0;
      piVar8[lVar10] = 0;
      piVar11[lVar10] = 0;
      *(undefined4 *)((long)pvVar12 + lVar10 * 4) = 0;
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->NumNeighbors);
  }
  iVar9 = 0;
  uVar19 = 0x1e;
  do {
    if (this->AnnArray[uVar19] != (ANN *)0x0) {
      ANN::NearestNeighbor
                (this->AnnArray[uVar19],this->topology,this->scaling,x,this->NumNeighbors,&local_80,
                 &local_78);
      iVar9 = this->NumNeighbors;
      if (0 < (long)iVar9) {
        pAVar13 = *best_dist;
        piVar11 = *best_idx;
        iVar15 = 0;
        iVar16 = 0;
        uVar18 = 1;
        do {
          if (pAVar13[iVar16] <= local_80[iVar15]) {
            *(ANNcoord *)((long)pvVar14 + uVar18 * 8 + -8) = pAVar13[iVar16];
            *(int *)((long)pvVar12 + uVar18 * 4 + -4) = piVar11[iVar16];
            iVar16 = iVar16 + 1;
          }
          else {
            *(ANNcoord *)((long)pvVar14 + uVar18 * 8 + -8) = local_80[iVar15];
            *(int *)((long)pvVar12 + uVar18 * 4 + -4) = local_78[iVar15];
            iVar15 = iVar15 + 1;
          }
        } while (((iVar16 < iVar9) && (iVar15 < iVar9)) &&
                (bVar20 = uVar18 < (ulong)(long)iVar9, uVar18 = uVar18 + 1, bVar20));
      }
      if (0 < this->NumNeighbors) {
        pAVar13 = *best_dist;
        piVar11 = *best_idx;
        lVar10 = 0;
        do {
          pAVar13[lVar10] = *(ANNcoord *)((long)pvVar14 + lVar10 * 8);
          piVar11[lVar10] = *(int *)((long)pvVar12 + lVar10 * 4);
          lVar10 = lVar10 + 1;
        } while (lVar10 < this->NumNeighbors);
      }
      iVar9 = ANN::LastNode(this->AnnArray[uVar19]);
      iVar9 = (uint)(iVar9 != this->size) + iVar9;
    }
    bVar20 = 4 < uVar19;
    uVar19 = uVar19 - 1;
  } while (bVar20);
  if (iVar9 != this->size) {
    local_90 = (long)iVar9;
    do {
      dVar23 = 0.0;
      if (0 < this->dimension) {
        pAVar13 = this->points_coor[local_90];
        iVar9 = 0;
        do {
          iVar15 = this->topology[iVar9];
          if (iVar15 == 3) {
            dVar21 = pAVar13[iVar9];
            pAVar7 = *x;
            dVar22 = pAVar7[iVar9];
            dVar1 = pAVar13[(long)iVar9 + 1];
            dVar2 = pAVar13[(long)iVar9 + 2];
            dVar3 = pAVar7[(long)iVar9 + 1];
            dVar4 = pAVar7[(long)iVar9 + 2];
            dVar5 = pAVar13[(long)iVar9 + 3];
            dVar6 = pAVar7[(long)iVar9 + 3];
            local_58 = dVar5 * dVar6 + dVar2 * dVar4 + dVar21 * dVar22 + dVar1 * dVar3;
            if (1.0 < local_58) {
              local_58 = local_58 /
                         ((dVar6 * dVar6 + dVar4 * dVar4 + dVar22 * dVar22 + dVar3 * dVar3) *
                         (dVar5 * dVar5 + dVar2 * dVar2 + dVar21 * dVar21 + dVar1 * dVar1));
            }
            uStack_50 = 0;
            iVar16 = iVar9 + 3;
            local_60 = dVar23;
            local_68 = acos(local_58);
            local_48 = -local_58;
            uStack_40 = uStack_50 ^ 0x8000000000000000;
            dVar23 = acos(local_48);
            dVar23 = acos((double)(~-(ulong)(dVar23 < local_68) & (ulong)local_58 |
                                  (ulong)local_48 & -(ulong)(dVar23 < local_68)));
            dVar23 = dVar23 * this->scaling[iVar9];
            dVar23 = local_60 + dVar23 * dVar23;
          }
          else {
            iVar16 = iVar9;
            if (iVar15 == 2) {
              dVar22 = ABS(pAVar13[iVar9] - (*x)[iVar9]);
              dVar21 = 6.283185307179586 - dVar22;
              if (dVar22 <= 6.283185307179586 - dVar22) {
                dVar21 = dVar22;
              }
              dVar21 = dVar21 * this->scaling[iVar9];
              dVar23 = dVar23 + dVar21 * dVar21;
            }
            else if (iVar15 == 1) {
              dVar21 = (pAVar13[iVar9] - (*x)[iVar9]) * this->scaling[iVar9];
              dVar23 = dVar23 + dVar21 * dVar21;
            }
          }
          iVar9 = iVar16 + 1;
        } while (iVar9 < this->dimension);
      }
      if (dVar23 < 0.0) {
        dVar23 = sqrt(dVar23);
      }
      else {
        dVar23 = SQRT(dVar23);
      }
      iVar9 = this->NumNeighbors;
      uVar19 = (ulong)iVar9;
      iVar15 = iVar9 + 2;
      if (0 < (long)uVar19) {
        bVar20 = true;
        uVar18 = 0;
        do {
          if (dVar23 < (*best_dist)[uVar18]) {
            bVar20 = false;
          }
          iVar16 = (int)uVar18;
          if ((*best_dist)[uVar18] <= dVar23) {
            iVar16 = iVar15;
          }
          iVar15 = iVar16;
        } while ((bVar20) && (uVar18 = uVar18 + 1, uVar18 < uVar19));
      }
      if (iVar15 < iVar9) {
        lVar10 = (long)iVar15;
        if (iVar15 < iVar9 + -1) {
          pAVar13 = *best_dist;
          piVar11 = *best_idx;
          lVar17 = uVar19 - 1;
          iVar9 = iVar9 + -2;
          do {
            pAVar13[lVar17] = pAVar13[iVar9];
            piVar11[lVar17] = piVar11[iVar9];
            lVar17 = lVar17 + -1;
            iVar9 = iVar9 + -1;
          } while (lVar10 < lVar17);
        }
        (*best_idx)[lVar10] = (int)local_90;
        (*best_dist)[lVar10] = dVar23;
      }
      local_90 = local_90 + 1;
    } while (this->size != (int)local_90);
  }
  iVar9 = this->NumNeighbors;
  if (0 < (long)iVar9) {
    lVar10 = 0;
    do {
      (*local_70)[lVar10] = this->points_ptr[(*best_idx)[lVar10]];
      lVar10 = lVar10 + 1;
    } while (iVar9 != lVar10);
  }
  if (local_78 != (int *)0x0) {
    operator_delete__(local_78);
  }
  operator_delete__(pvVar12);
  operator_delete__(pvVar14);
  if (local_80 != (ANNpoint)0x0) {
    operator_delete__(local_80);
  }
  return;
}

Assistant:

void MultiANN::NearestNeighbor(
    const ANNpoint &x,  // query point
    ANNpoint &
        best_dist,     // distances from the  nearest neighbors to x (returned)
    int *&best_idx,    // indices of the nearest neighbors to x (returned)
    void **&best_ptr)  // pointers to the nearest neighbors to x (returned)
{
    int n, n_last, j, k, l, m;
    double d;

    int *node_list = new int[NumNeighbors];
    int *help_list = new int[NumNeighbors];
    double *d1 = new double[NumNeighbors];
    double *d_help = new double[NumNeighbors];

    for (int i = 0; i < NumNeighbors; i++) {
        best_dist[i] = INFINITY;
        d1[i] = 0.0;
        d_help[i] = 0.0;
        best_idx[i] = 0;
        node_list[i] = 0;
        help_list[i] = 0;
    }

    n_last = n = 0;  // Keeps the warnings away

    // Find the nearest neighbor
    // First check the ANN trees
    for (k = ANN_MAXIMUM_INDEX; k >= ANN_STARTING_INDEX; k--) {
        if (AnnArray[k]) {
            AnnArray[k]->NearestNeighbor(topology, scaling, x, NumNeighbors, d1,
                                         node_list);
            m = 0;
            j = 0;
            l = 0;
            while (m < NumNeighbors && j < NumNeighbors && l < NumNeighbors) {
                if (best_dist[m] > d1[j]) {
                    d_help[l] = d1[j];
                    help_list[l] = node_list[j];
                    j++;
                    l++;
                } else {
                    d_help[l] = best_dist[m];
                    help_list[l] = best_idx[m];
                    m++;
                    l++;
                }
            }
            for (int i = 0; i < NumNeighbors; i++) {
                best_dist[i] = d_help[i];
                best_idx[i] = help_list[i];
            }
            n_last = AnnArray[k]->LastNode();
            if (n_last != size) n_last++;
        }
    }

    // Check the new nodes, which are not yet in the ANN tree
    for (n = n_last; n != size; n++) {
        ANNpoint x1 = points_coor[n];
        d = 0.0;
        for (int i = 0; i < dimension; i++) {
            if (topology[i] == 1) {
                d += ANN_POW(scaling[i] * (x1[i] - x[i]));
            } else if (topology[i] == 2) {
                double t = fabs(x1[i] - x[i]);
                double t1 = ANN_MIN(t, 2.0 * PI - t);
                d += ANN_POW(scaling[i] * t1);
            } else if (topology[i] == 3) {
                double fd = x1[i] * x[i] + x1[i + 1] * x[i + 1] +
                            x1[i + 2] * x[i + 2] + x1[i + 3] * x[i + 3];
                if (fd > 1) {
                    double norm1 = x1[i] * x1[i] + x1[i + 1] * x1[i + 1] +
                                   x1[i + 2] * x1[i + 2] +
                                   x1[i + 3] * x1[i + 3];
                    double norm2 = x[i] * x[i] + x[i + 1] * x[i + 1] +
                                   x[i + 2] * x[i + 2] + x[i + 3] * x[i + 3];
                    fd = fd / (norm1 * norm2);
                }
                double dtheta = ANN_MIN(acos(fd), acos(-fd));
                d += ANN_POW(scaling[i] * dtheta);
                i = i + 3;
            }
        }
        d = sqrt(d);
        bool flag = true;
        int ind = NumNeighbors + 2;
        j = 0;
        while (flag && j < NumNeighbors) {
            if (d < best_dist[j]) {
                flag = false;
                ind = j;
            }
            j++;
        }
        if (ind < NumNeighbors) {
            for (int m = (NumNeighbors - 1); m > ind; m--) {
                best_dist[m] = best_dist[m - 1];
                best_idx[m] = best_idx[m - 1];
            }
            best_idx[ind] = n;
            best_dist[ind] = d;
        }
    }

    for (int i = 0; i < NumNeighbors; i++) {
        best_ptr[i] = points_ptr[best_idx[i]];
    }

    delete[] node_list;
    delete[] help_list;
    delete[] d_help;
    delete[] d1;
}